

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_first_steps_with_template_bindings.cpp
# Opt level: O2

int main(void)

{
  return 0;
}

Assistant:

int main() {
  // clang-format off
  const auto injector = di::make_injector(
    di::bind<Greater>().to<hello>()
  );
  // clang-format on

  auto object = injector.create<example>();
  static_assert(std::is_same<hello, decltype(object)::type>{}, "");
}